

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lex_newline(LexState *ls)

{
  byte *pbVar1;
  int iVar2;
  LexState *in_RDI;
  LexChar old;
  uint local_24;
  uint local_20;
  LexState *pLVar3;
  LexState *pLVar4;
  
  iVar2 = in_RDI->c;
  pLVar3 = in_RDI;
  if (in_RDI->p < in_RDI->pe) {
    pbVar1 = (byte *)in_RDI->p;
    in_RDI->p = (char *)(pbVar1 + 1);
    local_20 = (uint)*pbVar1;
  }
  else {
    local_20 = lex_more(in_RDI);
  }
  in_RDI->c = local_20;
  pLVar4 = pLVar3;
  if (((pLVar3->c == 10) || (pLVar3->c == 0xd)) && (pLVar3->c != iVar2)) {
    if (pLVar3->p < pLVar3->pe) {
      pbVar1 = (byte *)pLVar3->p;
      pLVar3->p = (char *)(pbVar1 + 1);
      local_24 = (uint)*pbVar1;
    }
    else {
      local_24 = lex_more(pLVar3);
    }
    pLVar3->c = local_24;
  }
  iVar2 = pLVar4->linenumber + 1;
  pLVar4->linenumber = iVar2;
  if (0x7ffffeff < iVar2) {
    lj_lex_error(pLVar4,(LexToken)(ulong)(uint)pLVar4->tok,LJ_ERR_XLINES);
  }
  return;
}

Assistant:

static void lex_newline(LexState *ls)
{
  LexChar old = ls->c;
  lj_assertLS(lex_iseol(ls), "bad usage");
  lex_next(ls);  /* Skip "\n" or "\r". */
  if (lex_iseol(ls) && ls->c != old) lex_next(ls);  /* Skip "\n\r" or "\r\n". */
  if (++ls->linenumber >= LJ_MAX_LINE)
    lj_lex_error(ls, ls->tok, LJ_ERR_XLINES);
}